

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void av1_setup_tpl_buffers
               (AV1_PRIMARY *ppi,CommonModeInfoParams *mi_params,int width,int height,
               int byte_alignment,int lag_in_frames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TplTxfmStats *pTVar4;
  TplDepStats *pTVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  YV12_BUFFER_CONFIG *ybf;
  int *piVar9;
  
  (ppi->tpl_data).tpl_stats_block_mis_log2 = '\x02';
  (ppi->tpl_data).tpl_bsize_1d = '\x10';
  (ppi->tpl_data).border_in_pixels = 0x20;
  iVar1 = (ppi->cpi->sf).tpl_sf.use_y_only_rate_distortion;
  iVar3 = mi_params->mi_rows;
  iVar2 = mi_params->mi_cols;
  uVar7 = iVar2 + 0x1f >> 2 & 0xfffffff8;
  for (lVar8 = 0; lVar8 != 0x2760; lVar8 = lVar8 + 0x60) {
    *(undefined1 *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + -0x20) = 0;
    *(uint *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + 0x24) = uVar7;
    *(uint *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + 0x28) =
         iVar3 + 0x1f >> 2 & 0xfffffff8;
    *(uint *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + 0x20) = uVar7;
    *(int *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + 0x2c) = iVar3;
    *(int *)((long)(ppi->tpl_data).tpl_stats_buffer[0].ref_map_index + lVar8 + 0x30) = iVar2;
  }
  (ppi->tpl_data).tpl_frame = (ppi->tpl_data).tpl_stats_buffer + 9;
  if (1 < lag_in_frames) {
    pTVar4 = (TplTxfmStats *)aom_calloc(0x69,0x1010);
    (ppi->tpl_data).txfm_stats_list = pTVar4;
    if (pTVar4 == (TplTxfmStats *)0x0) {
      aom_internal_error(&ppi->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tpl_data->txfm_stats_list");
    }
    ybf = (ppi->tpl_data).tpl_rec_pool;
    piVar9 = &(ppi->tpl_data).tpl_stats_buffer[0].height;
    for (uVar6 = 0; (uint)lag_in_frames != uVar6; uVar6 = uVar6 + 1) {
      pTVar5 = (TplDepStats *)aom_calloc((long)*piVar9 * (long)piVar9[-1],200);
      (ppi->tpl_data).tpl_stats_pool[uVar6] = pTVar5;
      if (pTVar5 == (TplDepStats *)0x0) {
        aom_internal_error(&ppi->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tpl_data->tpl_stats_pool[frame]");
      }
      iVar3 = aom_alloc_frame_buffer
                        (ybf,width,height,(ppi->seq_params).subsampling_x,
                         (ppi->seq_params).subsampling_y,(uint)(ppi->seq_params).use_highbitdepth,
                         (ppi->tpl_data).border_in_pixels,byte_alignment,false,(uint)(iVar1 != 0));
      if (iVar3 != 0) {
        aom_internal_error(&ppi->error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer");
      }
      ybf = ybf + 1;
      piVar9 = piVar9 + 0x18;
    }
  }
  return;
}

Assistant:

void av1_setup_tpl_buffers(AV1_PRIMARY *const ppi,
                           CommonModeInfoParams *const mi_params, int width,
                           int height, int byte_alignment, int lag_in_frames) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  TplParams *const tpl_data = &ppi->tpl_data;
  set_tpl_stats_block_size(&tpl_data->tpl_stats_block_mis_log2,
                           &tpl_data->tpl_bsize_1d);
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  tpl_data->border_in_pixels =
      ALIGN_POWER_OF_TWO(tpl_data->tpl_bsize_1d + 2 * AOM_INTERP_EXTEND, 5);

  const int alloc_y_plane_only =
      ppi->cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : 0;
  for (int frame = 0; frame < MAX_LENGTH_TPL_FRAME_STATS; ++frame) {
    const int mi_cols =
        ALIGN_POWER_OF_TWO(mi_params->mi_cols, MAX_MIB_SIZE_LOG2);
    const int mi_rows =
        ALIGN_POWER_OF_TWO(mi_params->mi_rows, MAX_MIB_SIZE_LOG2);
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame];
    tpl_frame->is_valid = 0;
    tpl_frame->width = mi_cols >> block_mis_log2;
    tpl_frame->height = mi_rows >> block_mis_log2;
    tpl_frame->stride = tpl_data->tpl_stats_buffer[frame].width;
    tpl_frame->mi_rows = mi_params->mi_rows;
    tpl_frame->mi_cols = mi_params->mi_cols;
  }
  tpl_data->tpl_frame = &tpl_data->tpl_stats_buffer[REF_FRAMES + 1];

  // If lag_in_frames <= 1, TPL module is not invoked. Hence dynamic memory
  // allocations are avoided for buffers in tpl_data.
  if (lag_in_frames <= 1) return;

  AOM_CHECK_MEM_ERROR(&ppi->error, tpl_data->txfm_stats_list,
                      aom_calloc(MAX_LENGTH_TPL_FRAME_STATS,
                                 sizeof(*tpl_data->txfm_stats_list)));

  for (int frame = 0; frame < lag_in_frames; ++frame) {
    AOM_CHECK_MEM_ERROR(
        &ppi->error, tpl_data->tpl_stats_pool[frame],
        aom_calloc(tpl_data->tpl_stats_buffer[frame].width *
                       tpl_data->tpl_stats_buffer[frame].height,
                   sizeof(*tpl_data->tpl_stats_buffer[frame].tpl_stats_ptr)));

    if (aom_alloc_frame_buffer(
            &tpl_data->tpl_rec_pool[frame], width, height,
            seq_params->subsampling_x, seq_params->subsampling_y,
            seq_params->use_highbitdepth, tpl_data->border_in_pixels,
            byte_alignment, false, alloc_y_plane_only))
      aom_internal_error(&ppi->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate frame buffer");
  }
}